

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall FlowGraph::FindLoops(FlowGraph *this)

{
  Func **ppFVar1;
  IRKind IVar2;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  BasicBlock *headBlock;
  Instr *pIVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  Type *ppFVar8;
  BasicBlock *tailBlock;
  Iterator local_40;
  
  if ((this->hasLoop == true) &&
     (tailBlock = this->func->m_fg->tailBlock, tailBlock != (BasicBlock *)0x0)) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (((tailBlock->field_0x18 & 1) == 0) && (tailBlock->loop == (Loop *)0x0)) {
        local_40.list =
             &(tailBlock->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
        local_40.current = &(local_40.list)->super_SListNodeBase<Memory::ArenaAllocator>;
        while( true ) {
          if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
              (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar6) goto LAB_00412525;
            *puVar7 = 0;
          }
          pSVar3 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                   (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                    &(local_40.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          if (pSVar3 == local_40.list) break;
          local_40.current = (NodeBase *)pSVar3;
          ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                              (&local_40);
          headBlock = (*ppFVar8)->succBlock;
          if (headBlock == (BasicBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x4dd,"(succ)","succ");
            if (!bVar6) goto LAB_00412525;
            *puVar7 = 0;
          }
          if (((headBlock->field_0x18 & 4) != 0) && (headBlock->loop == (Loop *)0x0)) {
            BuildLoop(this,headBlock,tailBlock,(Loop *)0x0);
          }
        }
        if (((*(ushort *)&tailBlock->field_0x18 & 4) != 0) && (tailBlock->loop == (Loop *)0x0)) {
          *(ushort *)&tailBlock->field_0x18 = *(ushort *)&tailBlock->field_0x18 & 0xfffb;
          pIVar4 = tailBlock->firstInstr;
          IVar2 = pIVar4->m_kind;
          if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
            if (!bVar6) {
LAB_00412525:
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            *puVar7 = 0;
          }
          ppFVar1 = &pIVar4[1].m_func;
          *(byte *)ppFVar1 = *(byte *)ppFVar1 & 0xfe;
        }
      }
      tailBlock = tailBlock->prev;
    } while (tailBlock != (BasicBlock *)0x0);
  }
  return;
}

Assistant:

void
FlowGraph::FindLoops()
{
    if (!this->hasLoop)
    {
        return;
    }

    Func * func = this->func;

    FOREACH_BLOCK_BACKWARD_IN_FUNC(block, func)
    {
        if (block->loop != nullptr)
        {
            // Block already visited
            continue;
        }
        FOREACH_SUCCESSOR_BLOCK(succ, block)
        {
            if (succ->isLoopHeader && succ->loop == nullptr)
            {
                // Found a loop back-edge
                BuildLoop(succ, block);
            }
        } NEXT_SUCCESSOR_BLOCK;
        if (block->isLoopHeader && block->loop == nullptr)
        {
            // We would have built a loop for it if it was a loop...
            block->isLoopHeader = false;
            block->GetFirstInstr()->AsLabelInstr()->m_isLoopTop = false;
        }
    } NEXT_BLOCK_BACKWARD_IN_FUNC;
}